

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O0

string * __thiscall
kratos::InterfaceDefinition::var
          (string *__return_storage_ptr__,InterfaceDefinition *this,string *name,uint32_t width,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *size)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  bool bVar1;
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_120;
  undefined1 local_fd;
  string local_f0;
  _Self local_d0;
  _Self local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *size_local;
  string *psStack_b0;
  uint32_t width_local;
  string *name_local;
  InterfaceDefinition *this_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_98;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_c0 = size;
  size_local._4_4_ = width;
  psStack_b0 = name;
  name_local = (string *)this;
  this_local = (InterfaceDefinition *)__return_storage_ptr__;
  local_c8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
       ::find(&this->vars_,name);
  local_d0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
       ::end(&this->vars_);
  bVar1 = std::operator!=(&local_c8,&local_d0);
  __args = psStack_b0;
  if (!bVar1) {
    std::make_pair<unsigned_int&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
              (&local_120,(uint *)((long)&size_local + 4),local_c0);
    std::
    map<std::__cxx11::string,std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>
    ::
    emplace<std::__cxx11::string_const&,std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((map<std::__cxx11::string,std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>
                *)&this->vars_,__args,&local_120);
    std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~pair
              (&local_120);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psStack_b0);
    return __return_storage_ptr__;
  }
  local_fd = 1;
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&this->name_;
  local_38 = &local_f0;
  local_40 = "{0} already exists in {1}";
  local_48 = psStack_b0;
  fmt::v7::make_args_checked<std::__cxx11::string_const&,std::__cxx11::string&,char[26],char>
            (&local_78,(v7 *)0xb31f7e,(char (*) [26])psStack_b0,
             (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs,
             (remove_reference_t<std::__cxx11::basic_string<char>_&> *)size);
  local_58 = &local_78;
  local_88 = fmt::v7::to_string_view<char,_0>(local_40);
  local_28 = &local_98;
  local_30 = local_58;
  local_20 = local_58;
  local_10 = local_58;
  local_18 = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0xdd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_58);
  format_str.size_ = local_98.desc_;
  format_str.data_ = (char *)local_88.size_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_98.field_1.values_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_f0,(detail *)local_88.data_,format_str,args);
  UserException::UserException(this_00,&local_f0);
  local_fd = 0;
  __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
}

Assistant:

std::string InterfaceDefinition::var(const std::string& name, uint32_t width,
                                     const std::vector<uint32_t>& size) {
    if (vars_.find(name) != vars_.end())
        throw UserException(::format("{0} already exists in {1}", name, name_));
    vars_.emplace(name, std::make_pair(width, size));
    return name;
}